

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geom.cpp
# Opt level: O0

CartesianPosition * ear::toCartesianPosition(PolarPosition position)

{
  double X;
  double Y;
  PolarPosition position_00;
  Scalar *pSVar1;
  CartesianPosition *in_RDI;
  double in_stack_ffffffffffffffa0;
  DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> local_20 [8];
  Vector3d cartesian;
  
  position_00.distance = in_stack_ffffffffffffffa0;
  position_00.azimuth = (double)SUB168(position._0_16_,0);
  position_00.elevation = (double)SUB168(position._0_16_,8);
  toCartesianVector3d(position_00);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[](local_20,0);
  X = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[](local_20,1);
  Y = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[](local_20,2);
  CartesianPosition::CartesianPosition(in_RDI,X,Y,*pSVar1);
  return in_RDI;
}

Assistant:

CartesianPosition toCartesianPosition(PolarPosition position) {
    auto cartesian = toCartesianVector3d(position);
    return CartesianPosition(cartesian[0], cartesian[1], cartesian[2]);
  }